

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O3

int getTankValue(int param,Node *node,double *value,Network *nw)

{
  int iVar1;
  pointer pcVar2;
  double dVar3;
  undefined1 local_50 [8];
  string name;
  
  name.field_2._8_8_ = (nw->units).factors[1];
  *value = 0.0;
  iVar1 = (*(node->super_Element)._vptr_Element[2])(node);
  if (iVar1 != 1) {
    return 0;
  }
  iVar1 = 0xcb;
  if (0x10 < param - 8U) {
    return 0xcb;
  }
  dVar3 = (double)name.field_2._8_8_ * (double)name.field_2._8_8_ * (double)name.field_2._8_8_;
  switch(param) {
  case 8:
    pcVar2 = (pointer)node->head;
    goto LAB_0012162f;
  default:
    goto switchD_0012151c_caseD_9;
  case 0xe:
    name.field_2._8_8_ = dVar3;
    dVar3 = Tank::findVolume((Tank *)node,node->head);
    goto LAB_00121635;
  case 0xf:
    dVar3 = (double)*(int *)&node[1].xCoord;
    break;
  case 0x10:
    dVar3 = dVar3 * node[1].initQual * node[1].fullDemand;
    break;
  case 0x11:
    dVar3 = (double)name.field_2._8_8_ * *(double *)&node[1].super_Element.name.field_2;
    break;
  case 0x12:
    dVar3 = dVar3 * *(double *)((long)&node[1].super_Element.name.field_2 + 8);
    break;
  case 0x13:
    dVar3 = node[1].elev;
    if (dVar3 == 0.0) {
      dVar3 = -1.0;
      break;
    }
    local_50 = (undefined1  [8])&name._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,*(long *)((long)dVar3 + 8),
               *(long *)((long)dVar3 + 0x10) + *(long *)((long)dVar3 + 8));
    iVar1 = Network::indexOf(nw,CURVE,(string *)local_50);
    *value = (double)iVar1;
    if (local_50 != (undefined1  [8])&name._M_string_length) {
      operator_delete((void *)local_50);
    }
    if (iVar1 < 0) {
      return 0xcd;
    }
    goto LAB_0012163d;
  case 0x14:
    pcVar2 = node[1].super_Element.name._M_dataplus._M_p;
    goto LAB_0012162f;
  case 0x15:
    pcVar2 = (pointer)node[1].super_Element.name._M_string_length;
LAB_0012162f:
    dVar3 = (double)pcVar2 - node->elev;
LAB_00121635:
    dVar3 = (double)name.field_2._8_8_ * dVar3;
    break;
  case 0x16:
    dVar3 = node[1].initQual;
    break;
  case 0x17:
    dVar3 = *(double *)&node[1].super_Element.index;
    break;
  case 0x18:
    dVar3 = dVar3 * node[1].actualDemand;
  }
  *value = dVar3;
LAB_0012163d:
  iVar1 = 0;
switchD_0012151c_caseD_9:
  return iVar1;
}

Assistant:

int getTankValue(int param, Node* node, double* value, Network* nw)
{
    double lcf = nw->ucf(Units::LENGTH);
    double vcf = lcf * lcf * lcf;
    *value = 0.0;
    if ( node->type() != Node::TANK ) return 0;
    Tank* tank = static_cast<Tank*>(node);
    switch (param)
    {
    case EN_TANKLEVEL:
        *value = (tank->head - tank->elev) * lcf;
        break;
    case EN_INITVOLUME:
        *value = tank->findVolume(tank->head) * vcf;
        break;
    case EN_MIXMODEL:
        *value = tank->mixingModel.type;
        break;
    case EN_MIXZONEVOL:
        *value = (tank->mixingModel.fracMixed * tank->maxVolume) * vcf;
        break;
    case EN_TANKDIAM:
        *value = tank->diameter * lcf;
        break;
    case EN_MINVOLUME:
        *value = tank->minVolume * vcf;
        break;
    case EN_VOLCURVE:
        if ( tank->volCurve )
        {
            string name = tank->volCurve->name;
            int index = nw->indexOf(Element::CURVE, name);
            *value = index;
            if ( index < 0 ) return 205;
        }
        else *value = -1.0;
        break;
    case EN_MINLEVEL:
        *value = (tank->minHead - tank->elev) * lcf;
        break;
    case EN_MAXLEVEL:
        *value = (tank->maxHead - tank->elev) * lcf;
        break;
    case EN_MIXFRACTION:
        *value = tank->mixingModel.fracMixed;
        break;
    case EN_TANK_KBULK:
        *value = tank->bulkCoeff ;
        break;
    case EN_TANKVOLUME:
        *value = tank->volume * vcf;
        break;
    default: return 203;
    }
    return 0;
}